

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::SetDefaultAcIcaoType(DataRefs *this,string *type)

{
  bool bVar1;
  bool bVar2;
  logLevelTy lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  bool local_1;
  
  Doc8643::get(in_stack_ffffffffffffffb8);
  bVar1 = Doc8643::operator_cast_to_bool((Doc8643 *)0x13e447);
  bVar2 = Doc8643::operator_cast_to_bool((Doc8643 *)0x13e45c);
  if (bVar1 == bVar2) {
    lVar3 = GetLogLevel(&dataRefs);
    if ((int)lVar3 < 3) {
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x992,"SetDefaultAcIcaoType",logWARN,
             "A/c default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!"
             ,uVar4,uVar5);
    }
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    CreateMsgWindow(8.0,logWARN,
                    "A/c default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!"
                    ,uVar4,uVar5);
    local_1 = false;
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x818),in_RSI);
    std::__cxx11::string::c_str();
    XPMPSetDefaultPlaneICAO(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    lVar3 = GetLogLevel(&dataRefs);
    if ((int)lVar3 < 2) {
      uVar4 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x98c,"SetDefaultAcIcaoType",logINFO,"Default a/c type is \'%s\'",uVar4);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DataRefs::SetDefaultAcIcaoType(const std::string type)
{
    if (Doc8643::get(type) != DOC8643_EMPTY) {
        sDefaultAcIcaoType = type;
        XPMPSetDefaultPlaneICAO(type.c_str());  // inform libxplanemp
        LOG_MSG(logINFO,CFG_DEFAULT_AC_TYP_INFO,sDefaultAcIcaoType.c_str());
        return true;
    }

    // invalid type
    SHOW_MSG(logWARN,ERR_CFG_AC_DEFAULT,type.c_str(),
             sDefaultAcIcaoType.c_str());
    return false;
}